

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::QueueInsertMethod::~QueueInsertMethod(QueueInsertMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~QueueInsertMethod((QueueInsertMethod *)0x950008);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

QueueInsertMethod() : SystemSubroutine(KnownSystemName::Insert, SubroutineKind::Function) {}